

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O0

void __thiscall xray_re::se_monster::state_read(se_monster *this,xr_packet *packet,uint16_t size)

{
  uint16_t size_local;
  xr_packet *packet_local;
  se_monster *this_local;
  
  cse_alife_monster_base::state_read(&this->super_cse_alife_monster_base,packet,size);
  if (*(ushort *)
       &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
        super_cse_alife_creature_abstract.field_0x28 < 0x80) {
    if (*(ushort *)
         &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
          super_cse_alife_creature_abstract.field_0x28 < 0x7a) {
      if (*(short *)&(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
                     super_cse_alife_creature_abstract.field_0x28 == 0x76) {
        if ((2 < *(ushort *)
                  &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
                   super_cse_alife_creature_abstract.field_0x2a) &&
           (xr_packet::r_u8(packet,&(this->super_cse_alife_monster_base).super_cse_ph_skeleton.
                                    field_0x2e),
           2 < (byte)(this->super_cse_alife_monster_base).super_cse_ph_skeleton.field_0x2e)) {
          xr_packet::skip_sz(packet);
        }
        if (4 < *(ushort *)
                 &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
                  super_cse_alife_creature_abstract.field_0x2a) {
          xr_packet::r_bool(packet,(bool *)&(this->super_cse_alife_monster_base).
                                            super_cse_ph_skeleton.field_0x2f);
        }
      }
      else if (*(short *)&(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
                          super_cse_alife_creature_abstract.field_0x28 == 0x75) {
        if (3 < *(ushort *)
                 &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
                  super_cse_alife_creature_abstract.field_0x2a) {
          xr_packet::r_u8(packet,&(this->super_cse_alife_monster_base).super_cse_ph_skeleton.
                                  field_0x2e);
        }
      }
      else if (*(short *)&(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
                          super_cse_alife_creature_abstract.field_0x28 == 0x68) {
        if (2 < *(ushort *)
                 &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
                  super_cse_alife_creature_abstract.field_0x2a) {
          xr_packet::r_u8(packet,&(this->super_cse_alife_monster_base).super_cse_ph_skeleton.
                                  field_0x2e);
        }
      }
      else if (*(short *)&(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
                          super_cse_alife_creature_abstract.field_0x28 == 0x65) {
        if (1 < *(ushort *)
                 &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
                  super_cse_alife_creature_abstract.field_0x2a) {
          xr_packet::r_bool(packet,(bool *)&(this->super_cse_alife_monster_base).
                                            super_cse_ph_skeleton.field_0x2f);
        }
      }
      else if ((*(ushort *)
                 &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
                  super_cse_alife_creature_abstract.field_0x28 < 0x27) ||
              (0x2e < *(ushort *)
                       &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
                        super_cse_alife_creature_abstract.field_0x28)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x126,"virtual void xray_re::se_monster::state_read(xr_packet &, uint16_t)");
      }
    }
    else {
      if (0x7c < *(ushort *)
                  &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
                   super_cse_alife_creature_abstract.field_0x28) {
        __assert_fail("m_version <= CSE_VERSION_CS",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x10a,"virtual void xray_re::se_monster::state_read(xr_packet &, uint16_t)");
      }
      xr_packet::r_u8(packet,&(this->super_cse_alife_monster_base).super_cse_ph_skeleton.field_0x2e)
      ;
      if (2 < (byte)(this->super_cse_alife_monster_base).super_cse_ph_skeleton.field_0x2e) {
        xr_packet::skip_sz(packet);
      }
      if (6 < *(ushort *)
               &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
                super_cse_alife_creature_abstract.field_0x2a) {
        xr_packet::r_sz(packet,&this->m_squad_id);
      }
      if (7 < *(ushort *)
               &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
                super_cse_alife_creature_abstract.field_0x2a) {
        xr_packet::r_bool(packet,&this->m_sim_forced_online);
      }
    }
  }
  else {
    if (0x80 < *(ushort *)
                &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
                 super_cse_alife_creature_abstract.field_0x28) {
      __assert_fail("m_version <= CSE_VERSION_COP",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x104,"virtual void xray_re::se_monster::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_sz(packet,&this->m_off_level_vertex_id);
    xr_packet::r_sz(packet,&this->m_active_section);
  }
  return;
}

Assistant:

void se_monster::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_monster_base::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x80) {
		xr_assert(m_version <= CSE_VERSION_COP);

		packet.r_sz(m_off_level_vertex_id);
		packet.r_sz(m_active_section);
	}
	else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);
		packet.r_u8(m_job_online);
		if (m_job_online > 2)
			packet.skip_sz();
		if (m_script_version >= 7)
			packet.r_sz(m_squad_id);
		if (m_script_version >= 8)
			packet.r_bool(m_sim_forced_online);
	} else if (m_version == CSE_VERSION_SOC) {
		if (m_script_version >= 3) {
			packet.r_u8(m_job_online);
			if (m_job_online > 2)
				packet.skip_sz();
		}
		if (m_script_version >= 5)
			packet.r_bool(m_was_in_smart_terrain);
	} else if (m_version == CSE_VERSION_2571) {
		if (m_script_version >= 4)
			packet.r_u8(m_job_online);
	} else if (m_version == CSE_VERSION_2232) {
		if (m_script_version >= 3)
			packet.r_u8(m_job_online);
	} else if (m_version == CSE_VERSION_2215) {
		if (m_script_version >= 2)
			packet.r_bool(m_was_in_smart_terrain);
	} else if (m_version >= CSE_VERSION_0x27 && m_version <= CSE_VERSION_0x2e) {
		// no script entity
	} else {
		xr_not_implemented();
	}
}